

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

scalar __thiscall
absl::make_unique<MutableS2ShapeIndex::Iterator,MutableS2ShapeIndex::Iterator_const&>
          (absl *this,Iterator *args)

{
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar1;
  undefined8 uVar2;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar3;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)operator_new(0x40);
  *puVar4 = &PTR__IteratorBase_003040b8;
  puVar4[1] = (args->super_IteratorBase).id_.id_;
  puVar4[2] = (args->super_IteratorBase).cell_._M_b._M_p;
  *puVar4 = &PTR__IteratorBase_00304188;
  pbVar1 = (args->iter_).node;
  uVar2 = *(undefined8 *)&(args->iter_).position;
  pbVar3 = (args->end_).node;
  puVar4[3] = args->index_;
  puVar4[4] = pbVar1;
  puVar4[5] = uVar2;
  puVar4[6] = pbVar3;
  *(int *)(puVar4 + 7) = (args->end_).position;
  *(undefined8 **)this = puVar4;
  return (__uniq_ptr_data<MutableS2ShapeIndex::Iterator,_std::default_delete<MutableS2ShapeIndex::Iterator>,_true,_true>
          )(__uniq_ptr_data<MutableS2ShapeIndex::Iterator,_std::default_delete<MutableS2ShapeIndex::Iterator>,_true,_true>
            )this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}